

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaError GetAlsaStreamPointer(PaStream *s,PaAlsaStream **stream)

{
  PaUtilHostApiRepresentation *pPVar1;
  PaError extraout_EAX;
  PaError extraout_EAX_00;
  PaUtilHostApiRepresentation *in_RAX;
  int *piVar2;
  char *format;
  PaUtilHostApiRepresentation *hostApi;
  PaUtilHostApiRepresentation *local_18;
  
  local_18 = in_RAX;
  paUtilErr_ = PaUtil_ValidateStreamPointer(s);
  if (paUtilErr_ < 0) {
    PaUtil_DebugPrint(
                     "Expression \'PaUtil_ValidateStreamPointer( s )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4584\n"
                     );
    return extraout_EAX;
  }
  paUtilErr_ = PaUtil_GetHostApiRepresentation(&local_18,paALSA);
  if (paUtilErr_ < 0) {
    format = 
    "Expression \'PaUtil_GetHostApiRepresentation( &hostApi, paALSA )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4585\n"
    ;
  }
  else {
    pPVar1 = *(PaUtilHostApiRepresentation **)((long)s + 0x10);
    piVar2 = &local_18[2].info.deviceCount;
    if (pPVar1 == (PaUtilHostApiRepresentation *)piVar2 || pPVar1 == local_18 + 1) {
      *stream = (PaAlsaStream *)s;
      return (PaError)CONCAT71((int7)((ulong)piVar2 >> 8),
                               pPVar1 != (PaUtilHostApiRepresentation *)piVar2 &&
                               pPVar1 != local_18 + 1);
    }
    format = 
    "Expression \'PA_STREAM_REP( s )->streamInterface == &alsaHostApi->callbackStreamInterface || PA_STREAM_REP( s )->streamInterface == &alsaHostApi->blockingStreamInterface\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4590\n"
    ;
  }
  PaUtil_DebugPrint(format);
  return extraout_EAX_00;
}

Assistant:

static PaError GetAlsaStreamPointer( PaStream* s, PaAlsaStream** stream )
{
    PaError result = paNoError;
    PaUtilHostApiRepresentation* hostApi;
    PaAlsaHostApiRepresentation* alsaHostApi;

    PA_ENSURE( PaUtil_ValidateStreamPointer( s ) );
    PA_ENSURE( PaUtil_GetHostApiRepresentation( &hostApi, paALSA ) );
    alsaHostApi = (PaAlsaHostApiRepresentation*)hostApi;

    PA_UNLESS( PA_STREAM_REP( s )->streamInterface == &alsaHostApi->callbackStreamInterface
            || PA_STREAM_REP( s )->streamInterface == &alsaHostApi->blockingStreamInterface,
        paIncompatibleStreamHostApi );

    *stream = (PaAlsaStream*)s;
error:
    return paNoError;
}